

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

BoxArray * __thiscall amrex::BoxArray::growcoarsen(BoxArray *this,IntVect *ngrow,IntVect *iv)

{
  int iVar1;
  element_type *peVar2;
  uint uVar3;
  Box *pBVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int local_34 [3];
  
  uniqify(this);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = (int)((long)*(pointer *)
                       ((long)&(peVar2->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) -
                *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data >> 2) * -0x49249249;
  if (0 < (int)uVar8) {
    uVar9 = 0;
    do {
      pBVar4 = Box::grow((Box *)(uVar9 * 0x1c +
                                *(long *)&(((this->m_ref).
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data),ngrow);
      iVar1 = iv->vect[0];
      if ((iVar1 == 1) && (iv->vect[1] == 1)) {
        if (iv->vect[2] != 1) {
          uVar3 = (pBVar4->smallend).vect[0];
          goto LAB_0045637d;
        }
      }
      else {
        uVar3 = (pBVar4->smallend).vect[0];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 2;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 1;
            }
            else {
              uVar3 = uVar3 >> 1;
            }
          }
          else if ((int)uVar3 < 0) {
            uVar3 = ~((int)~uVar3 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
LAB_0045637d:
        (pBVar4->smallend).vect[0] = uVar3;
        uVar3 = (pBVar4->smallend).vect[1];
        iVar1 = iv->vect[1];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 2;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 1;
            }
            else {
              uVar3 = uVar3 >> 1;
            }
          }
          else if ((int)uVar3 < 0) {
            uVar3 = ~((int)~uVar3 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar4->smallend).vect[1] = uVar3;
        uVar3 = (pBVar4->smallend).vect[2];
        iVar1 = iv->vect[2];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 2;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = (int)uVar3 >> 1;
            }
            else {
              uVar3 = uVar3 >> 1;
            }
          }
          else if ((int)uVar3 < 0) {
            uVar3 = ~((int)~uVar3 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar4->smallend).vect[2] = uVar3;
        uVar3 = (pBVar4->btype).itype;
        if (uVar3 == 0) {
          uVar3 = (pBVar4->bigend).vect[0];
          iVar1 = iv->vect[0];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 2;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 1;
              }
              else {
                uVar3 = uVar3 >> 1;
              }
            }
            else if ((int)uVar3 < 0) {
              uVar3 = ~((int)~uVar3 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
          (pBVar4->bigend).vect[0] = uVar3;
          uVar3 = (pBVar4->bigend).vect[1];
          iVar1 = iv->vect[1];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 2;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 1;
              }
              else {
                uVar3 = uVar3 >> 1;
              }
            }
            else if ((int)uVar3 < 0) {
              uVar3 = ~((int)~uVar3 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
          (pBVar4->bigend).vect[1] = uVar3;
          uVar3 = (pBVar4->bigend).vect[2];
          iVar1 = iv->vect[2];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 2;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 1;
              }
              else {
                uVar3 = uVar3 >> 1;
              }
            }
            else if ((int)uVar3 < 0) {
              uVar3 = ~((int)~uVar3 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
        }
        else {
          local_34[0] = 0;
          local_34[1] = 0;
          local_34[2] = 0;
          lVar7 = 0;
          do {
            if (((uVar3 >> ((uint)lVar7 & 0x1f) & 1) != 0) &&
               ((pBVar4->bigend).vect[lVar7] % iv->vect[lVar7] != 0)) {
              local_34[lVar7] = 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          uVar5 = (pBVar4->bigend).vect[0];
          iVar1 = iv->vect[0];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 2;
              }
              else {
                uVar5 = uVar5 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 1;
              }
              else {
                uVar5 = uVar5 >> 1;
              }
            }
            else if ((int)uVar5 < 0) {
              uVar5 = ~((int)~uVar5 / iVar1);
            }
            else {
              uVar5 = (int)uVar5 / iVar1;
            }
          }
          (pBVar4->bigend).vect[0] = uVar5;
          uVar6 = (pBVar4->bigend).vect[1];
          iVar1 = iv->vect[1];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar6 < 0) {
                uVar6 = (int)uVar6 >> 2;
              }
              else {
                uVar6 = uVar6 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar6 < 0) {
                uVar6 = (int)uVar6 >> 1;
              }
              else {
                uVar6 = uVar6 >> 1;
              }
            }
            else if ((int)uVar6 < 0) {
              uVar6 = ~((int)~uVar6 / iVar1);
            }
            else {
              uVar6 = (int)uVar6 / iVar1;
            }
          }
          (pBVar4->bigend).vect[1] = uVar6;
          uVar3 = (pBVar4->bigend).vect[2];
          iVar1 = iv->vect[2];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 2;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = (int)uVar3 >> 1;
              }
              else {
                uVar3 = uVar3 >> 1;
              }
            }
            else if ((int)uVar3 < 0) {
              uVar3 = ~((int)~uVar3 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
          (pBVar4->bigend).vect[0] = uVar5 + local_34[0];
          (pBVar4->bigend).vect[1] = uVar6 + local_34[1];
          uVar3 = uVar3 + local_34[2];
        }
        (pBVar4->bigend).vect[2] = uVar3;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar8 & 0x7fffffff));
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::growcoarsen (IntVect const& ngrow, const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].grow(ngrow).coarsen(iv);
    }
    return *this;
}